

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int expr_is_leaf(uint version,int id)

{
  expr_t *peVar1;
  bool local_21;
  expr_t *expr;
  int id_local;
  uint version_local;
  
  peVar1 = expr_get_by_id(version,id);
  if (peVar1 == (expr_t *)0x0) {
    id_local = 0;
  }
  else {
    local_21 = false;
    if (peVar1->stack_arity == 0) {
      local_21 = peVar1->return_type != 0;
    }
    id_local = (int)local_21;
  }
  return id_local;
}

Assistant:

int
expr_is_leaf(
    unsigned int version,
    int id)
{
    const expr_t* expr = expr_get_by_id(version, id);

    if (!expr)
        return 0;

    return expr->stack_arity == 0 &&
           expr->return_type != 0;
}